

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_render.cpp
# Opt level: O0

Node * __thiscall OpacityTextures::build(OpacityTextures *this)

{
  mat4 matrix;
  mat4 matrix_00;
  mat4 matrix_01;
  rect2d geometry;
  rect2d geometry_00;
  rect2d geometry_01;
  rect2d geometry_02;
  rect2d geometry_03;
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  TransformNode *this_00;
  TransformNode *pTVar4;
  Node *pNVar5;
  rect2d rVar6;
  vec4 local_1b0;
  vec2 local_1a0;
  vec2 local_198;
  vec4 local_190;
  vec2 local_180;
  vec2 local_178;
  vec4 local_170;
  vec2 local_160;
  vec2 local_158;
  mat4 local_150;
  vec4 local_108;
  vec2 local_f8;
  vec2 local_f0;
  mat4 local_e8;
  mat4 local_a0;
  vec4 local_58;
  vec2 local_48;
  vec2 local_40;
  vec4 local_38;
  vec2 local_28;
  vec2 local_20;
  Node *local_18;
  Node *root;
  OpacityTextures *this_local;
  
  root = (Node *)this;
  pNVar1 = rengine::Node::create();
  local_18 = pNVar1;
  pNVar2 = &rengine::OpacityNode::create(0.5)->super_Node;
  rVar6 = rengine::rect2d::fromXywh(10.0,10.0,10.0,10.0);
  local_28 = rVar6.tl;
  local_20 = rVar6.br;
  rengine::vec4::vec4(&local_38,1.0,0.0,0.0,1.0);
  geometry_03.br = local_20;
  geometry_03.tl = local_28;
  pNVar3 = (Node *)rengine::RectangleNode::create(geometry_03,local_38);
  pNVar2 = rengine::Node::operator<<(pNVar2,pNVar3);
  rVar6 = rengine::rect2d::fromXywh(11.0,11.0,10.0,10.0);
  local_40 = rVar6.br;
  local_48 = rVar6.tl;
  rengine::vec4::vec4(&local_58,0.0,0.0,1.0,1.0);
  geometry_02.br = local_40;
  geometry_02.tl = local_48;
  pNVar3 = (Node *)rengine::RectangleNode::create(geometry_02,local_58);
  pNVar2 = rengine::Node::operator<<(pNVar2,pNVar3);
  pNVar1 = rengine::Node::operator<<(pNVar1,pNVar2);
  rengine::mat4::translate2D(&local_a0,30.0,10.0);
  matrix.m[2] = local_a0.m[2];
  matrix.m[3] = local_a0.m[3];
  matrix.m[0] = local_a0.m[0];
  matrix.m[1] = local_a0.m[1];
  matrix.m[4] = local_a0.m[4];
  matrix.m[5] = local_a0.m[5];
  matrix.m[6] = local_a0.m[6];
  matrix.m[7] = local_a0.m[7];
  matrix.m[8] = local_a0.m[8];
  matrix.m[9] = local_a0.m[9];
  matrix.m[10] = local_a0.m[10];
  matrix.m[0xb] = local_a0.m[0xb];
  matrix.m[0xc] = local_a0.m[0xc];
  matrix.m[0xd] = local_a0.m[0xd];
  matrix.m[0xe] = local_a0.m[0xe];
  matrix.m[0xf] = local_a0.m[0xf];
  matrix.type = local_a0.type;
  this_00 = rengine::TransformNode::create(matrix,0.0);
  pNVar2 = &rengine::OpacityNode::create(0.5)->super_Node;
  rengine::mat4::translate2D(&local_e8,1.0,1.0);
  matrix_00.m[2] = local_e8.m[2];
  matrix_00.m[3] = local_e8.m[3];
  matrix_00.m[0] = local_e8.m[0];
  matrix_00.m[1] = local_e8.m[1];
  matrix_00.m[4] = local_e8.m[4];
  matrix_00.m[5] = local_e8.m[5];
  matrix_00.m[6] = local_e8.m[6];
  matrix_00.m[7] = local_e8.m[7];
  matrix_00.m[8] = local_e8.m[8];
  matrix_00.m[9] = local_e8.m[9];
  matrix_00.m[10] = local_e8.m[10];
  matrix_00.m[0xb] = local_e8.m[0xb];
  matrix_00.m[0xc] = local_e8.m[0xc];
  matrix_00.m[0xd] = local_e8.m[0xd];
  matrix_00.m[0xe] = local_e8.m[0xe];
  matrix_00.m[0xf] = local_e8.m[0xf];
  matrix_00.type = local_e8.type;
  pTVar4 = rengine::TransformNode::create(matrix_00,0.0);
  rVar6 = rengine::rect2d::fromXywh(0.0,0.0,10.0,10.0);
  local_f8 = rVar6.tl;
  local_f0 = rVar6.br;
  rengine::vec4::vec4(&local_108,0.0,1.0,0.0,1.0);
  geometry_01.br = local_f0;
  geometry_01.tl = local_f8;
  pNVar3 = (Node *)rengine::RectangleNode::create(geometry_01,local_108);
  pNVar3 = rengine::Node::operator<<(&pTVar4->super_Node,pNVar3);
  pNVar2 = rengine::Node::operator<<(pNVar2,pNVar3);
  rengine::mat4::translate2D(&local_150,2.0,2.0);
  matrix_01.m[2] = local_150.m[2];
  matrix_01.m[3] = local_150.m[3];
  matrix_01.m[0] = local_150.m[0];
  matrix_01.m[1] = local_150.m[1];
  matrix_01.m[4] = local_150.m[4];
  matrix_01.m[5] = local_150.m[5];
  matrix_01.m[6] = local_150.m[6];
  matrix_01.m[7] = local_150.m[7];
  matrix_01.m[8] = local_150.m[8];
  matrix_01.m[9] = local_150.m[9];
  matrix_01.m[10] = local_150.m[10];
  matrix_01.m[0xb] = local_150.m[0xb];
  matrix_01.m[0xc] = local_150.m[0xc];
  matrix_01.m[0xd] = local_150.m[0xd];
  matrix_01.m[0xe] = local_150.m[0xe];
  matrix_01.m[0xf] = local_150.m[0xf];
  matrix_01.type = local_150.type;
  pTVar4 = rengine::TransformNode::create(matrix_01,0.0);
  rVar6 = rengine::rect2d::fromXywh(0.0,0.0,10.0,10.0);
  local_160 = rVar6.tl;
  local_158 = rVar6.br;
  rengine::vec4::vec4(&local_170,1.0,0.0,0.0,1.0);
  geometry_00.br = local_158;
  geometry_00.tl = local_160;
  pNVar3 = (Node *)rengine::RectangleNode::create(geometry_00,local_170);
  pNVar3 = rengine::Node::operator<<(&pTVar4->super_Node,pNVar3);
  pNVar2 = rengine::Node::operator<<(pNVar2,pNVar3);
  pNVar2 = rengine::Node::operator<<(&this_00->super_Node,pNVar2);
  pNVar1 = rengine::Node::operator<<(pNVar1,pNVar2);
  pNVar2 = &rengine::OpacityNode::create(0.8)->super_Node;
  pNVar3 = &rengine::OpacityNode::create(0.8)->super_Node;
  rVar6 = rengine::rect2d::fromXywh(100.0,10.0,10.0,10.0);
  local_180 = rVar6.tl;
  local_178 = rVar6.br;
  rengine::vec4::vec4(&local_190,1.0,0.0,0.0,1.0);
  geometry.br = local_178;
  geometry.tl = local_180;
  pNVar5 = (Node *)rengine::RectangleNode::create(geometry,local_190);
  pNVar3 = rengine::Node::operator<<(pNVar3,pNVar5);
  rVar6 = rengine::rect2d::fromXywh(101.0,11.0,10.0,10.0);
  local_198 = rVar6.br;
  local_1a0 = rVar6.tl;
  rengine::vec4::vec4(&local_1b0,0.0,0.0,1.0,1.0);
  rVar6.br = local_198;
  rVar6.tl = local_1a0;
  pNVar5 = (Node *)rengine::RectangleNode::create(rVar6,local_1b0);
  pNVar3 = rengine::Node::operator<<(pNVar3,pNVar5);
  pNVar2 = rengine::Node::operator<<(pNVar2,pNVar3);
  rengine::Node::operator<<(pNVar1,pNVar2);
  return local_18;
}

Assistant:

Node *build() override {
        Node *root = Node::create();

        *root

            // Two rectangles stacked on top of each other, no opacity bleed-through
            << &(*OpacityNode::create(0.5)
                 << RectangleNode::create(rect2d::fromXywh(10, 10, 10, 10), vec4(1, 0, 0, 1))
                 << RectangleNode::create(rect2d::fromXywh(11, 11, 10, 10), vec4(0, 0, 1, 1))
                )

            // Two rectangles stacked on top of each other, positioned with a transform node, no opacity bleed-through
            << &(*TransformNode::create(mat4::translate2D(30, 10))
                 << &(*OpacityNode::create(0.5)
                      << &(*TransformNode::create(mat4::translate2D(1, 1))
                           << RectangleNode::create(rect2d::fromXywh(0, 0, 10, 10), vec4(0, 1, 0, 1))
                          )
                      << &(*TransformNode::create(mat4::translate2D(2, 2))
                           << RectangleNode::create(rect2d::fromXywh(0, 0, 10, 10), vec4(1, 0, 0, 1))
                          )
                     )
                )

            // Nested layers
            << &(*OpacityNode::create(0.8)
                 << &(*OpacityNode::create(0.8)
                      << RectangleNode::create(rect2d::fromXywh(100, 10, 10, 10), vec4(1, 0, 0, 1))
                      << RectangleNode::create(rect2d::fromXywh(101, 11, 10, 10), vec4(0, 0, 1, 1))
                     )
                )

            ;

        return root;
    }